

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

int impl_GLSL_CompileShader(MOJOSHADER_parseData *pd,GLuint *s)

{
  GLuint GVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLint GVar4;
  GLint codelen;
  GLint ok;
  GLsizei len;
  int local_2c;
  GLint local_28;
  GLsizei local_24;
  
  local_28 = 0;
  local_2c = pd->output_len;
  GVar2 = 0x8b30;
  if (pd->shader_type != MOJOSHADER_TYPE_PIXEL) {
    GVar2 = 0;
  }
  GVar3 = 0x8b31;
  if (pd->shader_type != MOJOSHADER_TYPE_VERTEX) {
    GVar3 = GVar2;
  }
  if (ctx->have_opengl_2 == 0) {
    GVar1 = (*ctx->glCreateShaderObjectARB)(GVar3);
    (*ctx->glShaderSourceARB)(GVar1,1,&pd->output,&local_2c);
    (*ctx->glCompileShaderARB)(GVar1);
    (*ctx->glGetObjectParameterivARB)(GVar1,0x8b81,&local_28);
    GVar4 = local_28;
    if (local_28 != 0) goto LAB_00126719;
    local_24 = 0;
    (*ctx->glGetInfoLogARB)(GVar1,0x400,&local_24,error_buffer);
    (*ctx->glDeleteObjectARB)(GVar1);
  }
  else {
    GVar1 = (*ctx->glCreateShader)(GVar3);
    (*ctx->glShaderSource)(GVar1,1,&pd->output,&local_2c);
    (*ctx->glCompileShader)(GVar1);
    (*ctx->glGetShaderiv)(GVar1,0x8b81,&local_28);
    GVar4 = local_28;
    if (local_28 != 0) {
LAB_00126719:
      *s = GVar1;
      goto LAB_00126755;
    }
    local_24 = 0;
    (*ctx->glGetShaderInfoLog)(GVar1,0x400,&local_24,error_buffer);
    (*ctx->glDeleteShader)(GVar1);
  }
  *s = 0;
  local_28 = GVar4;
LAB_00126755:
  return (uint)(local_28 != 0);
}

Assistant:

static int impl_GLSL_CompileShader(const MOJOSHADER_parseData *pd, GLuint *s)
{
    GLint ok = 0;
    const GLint codelen = (GLint) pd->output_len;
    const GLenum shader_type = glsl_shader_type(pd->shader_type);

    if (ctx->have_opengl_2)
    {
        const GLuint shader = ctx->glCreateShader(shader_type);
        ctx->glShaderSource(shader, 1, (const GLchar**) &pd->output, &codelen);
        ctx->glCompileShader(shader);
        ctx->glGetShaderiv(shader, GL_COMPILE_STATUS, &ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetShaderInfoLog(shader, sizeof (error_buffer), &len,
                                 (GLchar *) error_buffer);
            ctx->glDeleteShader(shader);
            *s = 0;
            return 0;
        } // if

        *s = shader;
    } // if
    else
    {
        const GLhandleARB shader = ctx->glCreateShaderObjectARB(shader_type);
        assert(sizeof (shader) == sizeof (*s));  // not always true on OS X!
        ctx->glShaderSourceARB(shader, 1,
                              (const GLcharARB **) &pd->output, &codelen);
        ctx->glCompileShaderARB(shader);
        ctx->glGetObjectParameterivARB(shader,GL_OBJECT_COMPILE_STATUS_ARB,&ok);
        if (!ok)
        {
            GLsizei len = 0;
            ctx->glGetInfoLogARB(shader, sizeof (error_buffer), &len,
                                 (GLcharARB *) error_buffer);
            ctx->glDeleteObjectARB(shader);
            *s = 0;
            return 0;
        } // if

        *s = (GLuint) shader;
    } // else

    return 1;
}